

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

void Vga_ManStop(Vta_Man_t *p)

{
  sat_solver2 *psVar1;
  Vec_Bit_t *__ptr;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    Abc_Print(psVar1->nDBreduces,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  Vec_VecFreeP((Vec_Vec_t **)&p->vCores);
  Vec_VecFreeP((Vec_Vec_t **)&p->vFrames);
  __ptr = p->vSeenGla;
  if (__ptr != (Vec_Bit_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vSeenGla->pArray = (int *)0x0;
      __ptr = p->vSeenGla;
      if (__ptr == (Vec_Bit_t *)0x0) goto LAB_005015fe;
    }
    free(__ptr);
    p->vSeenGla = (Vec_Bit_t *)0x0;
  }
LAB_005015fe:
  Vec_IntFreeP(&p->vSeens);
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vAddedNew);
  sat_solver2_delete(p->pSat);
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  free(p->pObjs);
  free(p);
  return;
}

Assistant:

void Vga_ManStop( Vta_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vCores );
    Vec_VecFreeP( (Vec_Vec_t **)&p->vFrames );
    Vec_BitFreeP( &p->vSeenGla );
    Vec_IntFreeP( &p->vSeens );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vAddedNew );
    sat_solver2_delete( p->pSat );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}